

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void update_flags(void)

{
  result_f = dyn_p & 0x82 ^ 2;
  carry_f = dyn_p & 1;
  intd_f = dyn_p & 4;
  dec_f = dyn_p & 8;
  brk_f = dyn_p & 0x10;
  ovr_f = dyn_p & 0x40;
  if ((dyn_p & 0x82) == 0x82) {
    except = '\x01';
  }
  return;
}

Assistant:

void update_flags(void)        // update the flags depending on dyn_p
{
    result_f = (dyn_p & 0x82) ^ 2;
    carry_f = dyn_p & 0x01;
    intd_f = dyn_p & 0x04;
    dec_f = dyn_p & 0x08;
    brk_f = dyn_p & 0x10;
    ovr_f = dyn_p & 0x40;
    if ((dyn_p & 0x82) == 0x82) except = 1;
}